

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

void pnga_sprs_array_matvec_multiply(Integer s_a,Integer g_a,Integer g_v)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  int iVar10;
  Integer IVar11;
  long lVar12;
  long lVar13;
  void *__ptr;
  void *pvVar14;
  long in_RDI;
  double ival_3;
  double rval_3;
  double ibuf_3;
  double rbuf_3;
  double *_ptr_13;
  double *_sum_13;
  double *_buf_13;
  float ival_2;
  float rval_2;
  float ibuf_2;
  float rbuf_2;
  float *_ptr_12;
  float *_sum_12;
  float *_buf_12;
  double *_ptr_11;
  double *_sum_11;
  double *_buf_11;
  float *_ptr_10;
  float *_sum_10;
  float *_buf_10;
  longlong *_ptr_9;
  longlong *_sum_9;
  longlong *_buf_9;
  long *_ptr_8;
  long *_sum_8;
  long *_buf_8;
  int *_ptr_7;
  int *_sum_7;
  int *_buf_7;
  double ival_1;
  double rval_1;
  double ibuf_1;
  double rbuf_1;
  double *_ptr_6;
  double *_sum_6;
  double *_buf_6;
  float ival;
  float rval;
  float ibuf;
  float rbuf;
  float *_ptr_5;
  float *_sum_5;
  float *_buf_5;
  double *_ptr_4;
  double *_sum_4;
  double *_buf_4;
  float *_ptr_3;
  float *_sum_3;
  float *_buf_3;
  longlong *_ptr_2;
  longlong *_sum_2;
  longlong *_buf_2;
  long *_ptr_1;
  long *_sum_1;
  long *_buf_1;
  int *_ptr;
  int *_sum;
  int *_buf;
  Integer zflag;
  Integer vtype;
  Integer atype;
  Integer dims [7];
  Integer vrank;
  Integer arank;
  Integer vdim;
  Integer adim;
  Integer one;
  double one_r;
  Integer ncols;
  Integer iproc;
  Integer j;
  Integer i;
  int *jptr;
  int *iptr;
  int64_t *jlptr;
  int64_t *ilptr;
  int idx_size;
  void *vptr;
  void *vsum;
  Integer khi;
  Integer klo;
  Integer jhi;
  Integer jlo;
  Integer ihi;
  Integer ilo;
  Integer nproc;
  Integer me;
  Integer s_grp;
  int local_sync_end;
  int local_sync_begin;
  Integer s_hdl;
  void *in_stack_fffffffffffffcf8;
  Integer *in_stack_fffffffffffffd00;
  void *in_stack_fffffffffffffd08;
  Integer *in_stack_fffffffffffffd10;
  Integer *in_stack_fffffffffffffd18;
  Integer *in_stack_fffffffffffffd20;
  Integer in_stack_fffffffffffffd28;
  void *pvVar15;
  Integer in_stack_fffffffffffffd30;
  void *in_stack_fffffffffffffd70;
  Integer *in_stack_fffffffffffffd78;
  void *in_stack_fffffffffffffd80;
  void *in_stack_fffffffffffffd88;
  Integer *in_stack_fffffffffffffd90;
  Integer in_stack_fffffffffffffe20;
  Integer in_stack_fffffffffffffe98;
  Integer *pIVar16;
  char *in_stack_fffffffffffffea0;
  Integer *pIVar17;
  void *in_stack_fffffffffffffeb8;
  Integer *in_stack_fffffffffffffec0;
  Integer *in_stack_fffffffffffffec8;
  Integer in_stack_fffffffffffffed0;
  Integer *in_stack_ffffffffffffff08;
  Integer *in_stack_ffffffffffffff10;
  Integer *in_stack_ffffffffffffff18;
  Integer in_stack_ffffffffffffff20;
  long local_c0;
  long local_b8;
  long local_b0;
  Integer *local_80;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  Integer local_40;
  Integer local_38;
  Integer local_30;
  int local_28;
  int local_24;
  long local_20;
  long local_8;
  
  local_20 = in_RDI + 1000;
  local_30 = SPA[local_20].grp;
  local_8 = in_RDI;
  local_38 = pnga_pgroup_nodeid(local_30);
  local_40 = pnga_pgroup_nnodes(local_30);
  iVar9 = _ga_sync_begin;
  IVar11 = SPA[local_20].idx_size;
  local_24 = _ga_sync_begin;
  local_28 = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar9 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffffd00);
  }
  pnga_inquire(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
               in_stack_ffffffffffffff08);
  pIVar16 = in_stack_fffffffffffffec8;
  pnga_inquire((Integer)in_stack_fffffffffffffec8,in_stack_ffffffffffffff18,
               in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  pIVar17 = in_stack_fffffffffffffec8;
  if (in_stack_ffffffffffffff10 != (Integer *)0x1) {
    pnga_error(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  if (in_stack_ffffffffffffff08 != (Integer *)0x1) {
    pnga_error(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  if (pIVar16 != (Integer *)SPA[local_20].jdim) {
    pnga_error(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  if (pIVar17 != (Integer *)SPA[local_20].jdim) {
    pnga_error(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  if ((in_stack_fffffffffffffec0 != (Integer *)SPA[local_20].type) ||
     (in_stack_fffffffffffffeb8 != (void *)SPA[local_20].type)) {
    pnga_error(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  if (SPA[local_20].type == 0x3f8) {
    pnga_error(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  }
  pnga_mask_sync((long)local_24,(long)local_28);
  pnga_zero(in_stack_fffffffffffffe20);
  pnga_sprs_array_row_distribution
            (in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,in_stack_fffffffffffffd20,
             in_stack_fffffffffffffd18);
  __ptr = malloc(((local_50 - local_48) + 1) * SPA[local_20].size);
  pIVar17 = (Integer *)0x1;
  for (local_c0 = 0; local_c0 < local_40; local_c0 = local_c0 + 1) {
    pnga_sprs_array_column_distribution(local_8,local_c0,&local_58,&local_60);
    if ((int)IVar11 == 4) {
      pnga_sprs_array_access_col_block
                ((Integer)in_stack_fffffffffffffd90,(Integer)in_stack_fffffffffffffd88,
                 in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      if (local_80 != (Integer *)0x0) {
        if (SPA[local_20].type == 0x3e9) {
          pvVar14 = malloc(((local_60 - local_58) + 1) * 4);
          if (pIVar17 != (Integer *)0x0) {
            for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
              *(undefined4 *)((long)__ptr + (local_b0 - local_48) * 4) = 0;
            }
            pIVar17 = (Integer *)0x0;
          }
          pIVar16 = local_80;
          pvVar15 = __ptr;
          pnga_get(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,pIVar17);
          for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
            iVar9 = *(int *)(((local_b0 + 1) - local_48) * 4);
            iVar10 = *(int *)((local_b0 - local_48) * 4);
            for (local_b8 = 0; local_b8 < iVar9 - iVar10; local_b8 = local_b8 + 1) {
              *(int *)((long)pvVar15 + (local_b0 - local_48) * 4) =
                   *(int *)((long)pIVar16 + (*(int *)((local_b0 - local_48) * 4) + local_b8) * 4) *
                   *(int *)((long)pvVar14 +
                           (*(int *)((*(int *)((local_b0 - local_48) * 4) + local_b8) * 4) -
                           local_58) * 4) + *(int *)((long)pvVar15 + (local_b0 - local_48) * 4);
            }
          }
          free(pvVar14);
        }
        else if (SPA[local_20].type == 0x3ea) {
          pvVar14 = malloc(((local_60 - local_58) + 1) * 8);
          if (pIVar17 != (Integer *)0x0) {
            for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
              *(undefined8 *)((long)__ptr + (local_b0 - local_48) * 8) = 0;
            }
            pIVar17 = (Integer *)0x0;
          }
          pnga_get(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,pIVar17);
          for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
            iVar9 = *(int *)(((local_b0 + 1) - local_48) * 4);
            iVar10 = *(int *)((local_b0 - local_48) * 4);
            for (local_b8 = 0; local_b8 < iVar9 - iVar10; local_b8 = local_b8 + 1) {
              *(Integer *)((long)__ptr + (local_b0 - local_48) * 8) =
                   local_80[*(int *)((local_b0 - local_48) * 4) + local_b8] *
                   *(long *)((long)pvVar14 +
                            (*(int *)((*(int *)((local_b0 - local_48) * 4) + local_b8) * 4) -
                            local_58) * 8) + *(long *)((long)__ptr + (local_b0 - local_48) * 8);
            }
          }
          free(pvVar14);
        }
        else if (SPA[local_20].type == 0x3f8) {
          pvVar14 = malloc(((local_60 - local_58) + 1) * 8);
          if (pIVar17 != (Integer *)0x0) {
            for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
              *(undefined8 *)((long)__ptr + (local_b0 - local_48) * 8) = 0;
            }
            pIVar17 = (Integer *)0x0;
          }
          pnga_get(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,pIVar17);
          for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
            iVar9 = *(int *)(((local_b0 + 1) - local_48) * 4);
            iVar10 = *(int *)((local_b0 - local_48) * 4);
            for (local_b8 = 0; local_b8 < iVar9 - iVar10; local_b8 = local_b8 + 1) {
              *(Integer *)((long)__ptr + (local_b0 - local_48) * 8) =
                   local_80[*(int *)((local_b0 - local_48) * 4) + local_b8] *
                   *(long *)((long)pvVar14 +
                            (*(int *)((*(int *)((local_b0 - local_48) * 4) + local_b8) * 4) -
                            local_58) * 8) + *(long *)((long)__ptr + (local_b0 - local_48) * 8);
            }
          }
          free(pvVar14);
        }
        else if (SPA[local_20].type == 0x3eb) {
          pvVar14 = malloc(((local_60 - local_58) + 1) * 4);
          if (pIVar17 != (Integer *)0x0) {
            for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
              *(undefined4 *)((long)__ptr + (local_b0 - local_48) * 4) = 0;
            }
            pIVar17 = (Integer *)0x0;
          }
          pnga_get(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,pIVar17);
          for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
            iVar9 = *(int *)(((local_b0 + 1) - local_48) * 4);
            iVar10 = *(int *)((local_b0 - local_48) * 4);
            for (local_b8 = 0; local_b8 < iVar9 - iVar10; local_b8 = local_b8 + 1) {
              *(float *)((long)__ptr + (local_b0 - local_48) * 4) =
                   *(float *)((long)local_80 + (*(int *)((local_b0 - local_48) * 4) + local_b8) * 4)
                   * *(float *)((long)pvVar14 +
                               (*(int *)((*(int *)((local_b0 - local_48) * 4) + local_b8) * 4) -
                               local_58) * 4) + *(float *)((long)__ptr + (local_b0 - local_48) * 4);
            }
          }
          free(pvVar14);
        }
        else if (SPA[local_20].type == 0x3ec) {
          pvVar14 = malloc(((local_60 - local_58) + 1) * 8);
          if (pIVar17 != (Integer *)0x0) {
            for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
              *(undefined8 *)((long)__ptr + (local_b0 - local_48) * 8) = 0;
            }
            pIVar17 = (Integer *)0x0;
          }
          pnga_get(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,pIVar17);
          for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
            iVar9 = *(int *)(((local_b0 + 1) - local_48) * 4);
            iVar10 = *(int *)((local_b0 - local_48) * 4);
            for (local_b8 = 0; local_b8 < iVar9 - iVar10; local_b8 = local_b8 + 1) {
              *(double *)((long)__ptr + (local_b0 - local_48) * 8) =
                   (double)local_80[*(int *)((local_b0 - local_48) * 4) + local_b8] *
                   *(double *)
                    ((long)pvVar14 +
                    (*(int *)((*(int *)((local_b0 - local_48) * 4) + local_b8) * 4) - local_58) * 8)
                   + *(double *)((long)__ptr + (local_b0 - local_48) * 8);
            }
          }
          free(pvVar14);
        }
        else if (SPA[local_20].type == 0x3ee) {
          pvVar14 = malloc(((local_60 - local_58) + 1) * 8);
          if (pIVar17 != (Integer *)0x0) {
            for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
              *(undefined4 *)((long)__ptr + (local_b0 - local_48) * 8) = 0;
              *(undefined4 *)((long)__ptr + (local_b0 - local_48) * 8 + 4) = 0;
            }
            pIVar17 = (Integer *)0x0;
          }
          pnga_get(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,pIVar17);
          for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
            iVar9 = *(int *)(((local_b0 + 1) - local_48) * 4);
            iVar10 = *(int *)((local_b0 - local_48) * 4);
            for (local_b8 = 0; local_b8 < iVar9 - iVar10; local_b8 = local_b8 + 1) {
              fVar1 = *(float *)((long)pvVar14 +
                                (*(int *)((*(int *)((local_b0 - local_48) * 4) + local_b8) * 4) -
                                local_58) * 8);
              fVar2 = *(float *)((long)pvVar14 +
                                (*(int *)((*(int *)((local_b0 - local_48) * 4) + local_b8) * 4) -
                                local_58) * 8 + 4);
              fVar3 = *(float *)((long)pvVar14 +
                                (*(int *)((local_b0 - local_48) * 4) + local_b8) * 8);
              fVar4 = *(float *)((long)pvVar14 +
                                (*(int *)((local_b0 - local_48) * 4) + local_b8) * 8 + 4);
              *(float *)((long)__ptr + (local_b0 - local_48) * 8) = fVar3 * fVar1 + -(fVar4 * fVar2)
              ;
              *(float *)((long)__ptr + (local_b0 - local_48) * 8 + 4) =
                   fVar3 * fVar2 + fVar4 * fVar1;
            }
          }
          free(pvVar14);
        }
        else if (SPA[local_20].type == 0x3ef) {
          pvVar14 = malloc(((local_60 - local_58) + 1) * 0x10);
          if (pIVar17 != (Integer *)0x0) {
            for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
              *(undefined8 *)((long)__ptr + (local_b0 - local_48) * 0x10) = 0;
              *(undefined8 *)((long)__ptr + (local_b0 - local_48) * 0x10 + 8) = 0;
            }
            pIVar17 = (Integer *)0x0;
          }
          pnga_get(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,pIVar17);
          for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
            iVar9 = *(int *)(((local_b0 + 1) - local_48) * 4);
            iVar10 = *(int *)((local_b0 - local_48) * 4);
            for (local_b8 = 0; local_b8 < iVar9 - iVar10; local_b8 = local_b8 + 1) {
              dVar5 = *(double *)
                       ((long)pvVar14 +
                       (*(int *)((*(int *)((local_b0 - local_48) * 4) + local_b8) * 4) - local_58) *
                       0x10);
              dVar6 = *(double *)
                       ((long)pvVar14 +
                       (*(int *)((*(int *)((local_b0 - local_48) * 4) + local_b8) * 4) - local_58) *
                       0x10 + 8);
              dVar7 = *(double *)
                       ((long)pvVar14 + (*(int *)((local_b0 - local_48) * 4) + local_b8) * 0x10);
              dVar8 = *(double *)
                       ((long)pvVar14 + (*(int *)((local_b0 - local_48) * 4) + local_b8) * 0x10 + 8)
              ;
              *(double *)((long)__ptr + (local_b0 - local_48) * 0x10) =
                   dVar7 * dVar5 + -(dVar8 * dVar6);
              *(double *)((long)__ptr + (local_b0 - local_48) * 0x10 + 8) =
                   dVar7 * dVar6 + dVar8 * dVar5;
            }
          }
          free(pvVar14);
        }
      }
    }
    else {
      pnga_sprs_array_access_col_block
                ((Integer)in_stack_fffffffffffffd90,(Integer)in_stack_fffffffffffffd88,
                 in_stack_fffffffffffffd80,in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      if (local_80 != (Integer *)0x0) {
        if (SPA[local_20].type == 0x3e9) {
          pvVar14 = malloc(((local_60 - local_58) + 1) * 4);
          if (pIVar17 != (Integer *)0x0) {
            for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
              *(undefined4 *)((long)__ptr + (local_b0 - local_48) * 4) = 0;
            }
            pIVar17 = (Integer *)0x0;
          }
          pnga_get(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,pIVar17);
          for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
            lVar12 = *(long *)(((local_b0 + 1) - local_48) * 8);
            lVar13 = *(long *)((local_b0 - local_48) * 8);
            for (local_b8 = 0; local_b8 < lVar12 - lVar13; local_b8 = local_b8 + 1) {
              *(int *)((long)__ptr + (local_b0 - local_48) * 4) =
                   *(int *)((long)local_80 + (*(long *)((local_b0 - local_48) * 8) + local_b8) * 4)
                   * *(int *)((long)pvVar14 +
                             (*(long *)((*(long *)((local_b0 - local_48) * 8) + local_b8) * 8) -
                             local_58) * 4) + *(int *)((long)__ptr + (local_b0 - local_48) * 4);
            }
          }
          free(pvVar14);
        }
        else if (SPA[local_20].type == 0x3ea) {
          pvVar14 = malloc(((local_60 - local_58) + 1) * 8);
          if (pIVar17 != (Integer *)0x0) {
            for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
              *(undefined8 *)((long)__ptr + (local_b0 - local_48) * 8) = 0;
            }
            pIVar17 = (Integer *)0x0;
          }
          pnga_get(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,pIVar17);
          for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
            lVar12 = *(long *)(((local_b0 + 1) - local_48) * 8);
            lVar13 = *(long *)((local_b0 - local_48) * 8);
            for (local_b8 = 0; local_b8 < lVar12 - lVar13; local_b8 = local_b8 + 1) {
              *(Integer *)((long)__ptr + (local_b0 - local_48) * 8) =
                   local_80[*(long *)((local_b0 - local_48) * 8) + local_b8] *
                   *(long *)((long)pvVar14 +
                            (*(long *)((*(long *)((local_b0 - local_48) * 8) + local_b8) * 8) -
                            local_58) * 8) + *(long *)((long)__ptr + (local_b0 - local_48) * 8);
            }
          }
          free(pvVar14);
        }
        else if (SPA[local_20].type == 0x3f8) {
          pvVar14 = malloc(((local_60 - local_58) + 1) * 8);
          if (pIVar17 != (Integer *)0x0) {
            for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
              *(undefined8 *)((long)__ptr + (local_b0 - local_48) * 8) = 0;
            }
            pIVar17 = (Integer *)0x0;
          }
          in_stack_fffffffffffffd90 = local_80;
          pnga_get(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,pIVar17);
          for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
            lVar12 = *(long *)(((local_b0 + 1) - local_48) * 8);
            lVar13 = *(long *)((local_b0 - local_48) * 8);
            for (local_b8 = 0; local_b8 < lVar12 - lVar13; local_b8 = local_b8 + 1) {
              *(Integer *)((long)__ptr + (local_b0 - local_48) * 8) =
                   in_stack_fffffffffffffd90[*(long *)((local_b0 - local_48) * 8) + local_b8] *
                   *(long *)((long)pvVar14 +
                            (*(long *)((*(long *)((local_b0 - local_48) * 8) + local_b8) * 8) -
                            local_58) * 8) + *(long *)((long)__ptr + (local_b0 - local_48) * 8);
            }
          }
          free(pvVar14);
        }
        else if (SPA[local_20].type == 0x3eb) {
          in_stack_fffffffffffffd88 = malloc(((local_60 - local_58) + 1) * 4);
          if (pIVar17 != (Integer *)0x0) {
            for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
              *(undefined4 *)((long)__ptr + (local_b0 - local_48) * 4) = 0;
            }
            pIVar17 = (Integer *)0x0;
          }
          in_stack_fffffffffffffd78 = local_80;
          in_stack_fffffffffffffd80 = __ptr;
          pnga_get(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,pIVar17);
          for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
            lVar12 = *(long *)(((local_b0 + 1) - local_48) * 8);
            lVar13 = *(long *)((local_b0 - local_48) * 8);
            for (local_b8 = 0; local_b8 < lVar12 - lVar13; local_b8 = local_b8 + 1) {
              *(float *)((long)in_stack_fffffffffffffd80 + (local_b0 - local_48) * 4) =
                   *(float *)((long)in_stack_fffffffffffffd78 +
                             (*(long *)((local_b0 - local_48) * 8) + local_b8) * 4) *
                   *(float *)((long)in_stack_fffffffffffffd88 +
                             (*(long *)((*(long *)((local_b0 - local_48) * 8) + local_b8) * 8) -
                             local_58) * 4) +
                   *(float *)((long)in_stack_fffffffffffffd80 + (local_b0 - local_48) * 4);
            }
          }
          free(in_stack_fffffffffffffd88);
        }
        else if (SPA[local_20].type == 0x3ec) {
          in_stack_fffffffffffffd70 = malloc(((local_60 - local_58) + 1) * 8);
          if (pIVar17 != (Integer *)0x0) {
            for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
              *(undefined8 *)((long)__ptr + (local_b0 - local_48) * 8) = 0;
            }
            pIVar17 = (Integer *)0x0;
          }
          pnga_get(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,pIVar17);
          for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
            lVar12 = *(long *)(((local_b0 + 1) - local_48) * 8);
            lVar13 = *(long *)((local_b0 - local_48) * 8);
            for (local_b8 = 0; local_b8 < lVar12 - lVar13; local_b8 = local_b8 + 1) {
              *(double *)((long)__ptr + (local_b0 - local_48) * 8) =
                   (double)local_80[*(long *)((local_b0 - local_48) * 8) + local_b8] *
                   *(double *)
                    ((long)in_stack_fffffffffffffd70 +
                    (*(long *)((*(long *)((local_b0 - local_48) * 8) + local_b8) * 8) - local_58) *
                    8) + *(double *)((long)__ptr + (local_b0 - local_48) * 8);
            }
          }
          free(in_stack_fffffffffffffd70);
        }
        else if (SPA[local_20].type == 0x3ee) {
          pvVar14 = malloc(((local_60 - local_58) + 1) * 8);
          if (pIVar17 != (Integer *)0x0) {
            for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
              *(undefined4 *)((long)__ptr + (local_b0 - local_48) * 8) = 0;
              *(undefined4 *)((long)__ptr + (local_b0 - local_48) * 8 + 4) = 0;
            }
            pIVar17 = (Integer *)0x0;
          }
          pnga_get(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,pIVar17);
          for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
            lVar12 = *(long *)(((local_b0 + 1) - local_48) * 8);
            lVar13 = *(long *)((local_b0 - local_48) * 8);
            for (local_b8 = 0; local_b8 < lVar12 - lVar13; local_b8 = local_b8 + 1) {
              fVar1 = *(float *)((long)pvVar14 +
                                (*(long *)((*(long *)((local_b0 - local_48) * 8) + local_b8) * 8) -
                                local_58) * 8);
              fVar2 = *(float *)((long)pvVar14 +
                                (*(long *)((*(long *)((local_b0 - local_48) * 8) + local_b8) * 8) -
                                local_58) * 8 + 4);
              fVar3 = *(float *)((long)pvVar14 +
                                (*(long *)((local_b0 - local_48) * 8) + local_b8) * 8);
              fVar4 = *(float *)((long)pvVar14 +
                                (*(long *)((local_b0 - local_48) * 8) + local_b8) * 8 + 4);
              *(float *)((long)__ptr + (local_b0 - local_48) * 8) = fVar3 * fVar1 + -(fVar4 * fVar2)
              ;
              *(float *)((long)__ptr + (local_b0 - local_48) * 8 + 4) =
                   fVar3 * fVar2 + fVar4 * fVar1;
            }
          }
          free(pvVar14);
        }
        else if (SPA[local_20].type == 0x3ef) {
          pvVar14 = malloc(((local_60 - local_58) + 1) * 0x10);
          if (pIVar17 != (Integer *)0x0) {
            for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
              *(undefined8 *)((long)__ptr + (local_b0 - local_48) * 0x10) = 0;
              *(undefined8 *)((long)__ptr + (local_b0 - local_48) * 0x10 + 8) = 0;
            }
            pIVar17 = (Integer *)0x0;
          }
          in_stack_fffffffffffffd20 = local_80;
          pvVar15 = __ptr;
          pnga_get(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   in_stack_fffffffffffffeb8,pIVar17);
          for (local_b0 = local_48; local_b0 <= local_50; local_b0 = local_b0 + 1) {
            lVar12 = *(long *)(((local_b0 + 1) - local_48) * 8);
            lVar13 = *(long *)((local_b0 - local_48) * 8);
            for (local_b8 = 0; local_b8 < lVar12 - lVar13; local_b8 = local_b8 + 1) {
              in_stack_fffffffffffffd18 =
                   *(Integer **)
                    ((long)pvVar14 +
                    (*(long *)((*(long *)((local_b0 - local_48) * 8) + local_b8) * 8) - local_58) *
                    0x10);
              in_stack_fffffffffffffd10 =
                   *(Integer **)
                    ((long)pvVar14 +
                    (*(long *)((*(long *)((local_b0 - local_48) * 8) + local_b8) * 8) - local_58) *
                    0x10 + 8);
              in_stack_fffffffffffffd08 =
                   *(void **)((long)pvVar14 +
                             (*(long *)((local_b0 - local_48) * 8) + local_b8) * 0x10);
              in_stack_fffffffffffffd00 =
                   *(Integer **)
                    ((long)pvVar14 + (*(long *)((local_b0 - local_48) * 8) + local_b8) * 0x10 + 8);
              *(double *)((long)pvVar15 + (local_b0 - local_48) * 0x10) =
                   (double)in_stack_fffffffffffffd08 * (double)in_stack_fffffffffffffd18 +
                   -((double)in_stack_fffffffffffffd00 * (double)in_stack_fffffffffffffd10);
              *(double *)((long)pvVar15 + (local_b0 - local_48) * 0x10 + 8) =
                   (double)in_stack_fffffffffffffd08 * (double)in_stack_fffffffffffffd10 +
                   (double)in_stack_fffffffffffffd00 * (double)in_stack_fffffffffffffd18;
            }
          }
          free(pvVar14);
        }
      }
    }
  }
  if (local_48 <= local_50) {
    pnga_acc((Integer)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,in_stack_fffffffffffffd10,
             in_stack_fffffffffffffd08,in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
  }
  if (local_28 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffffd00);
  }
  free(__ptr);
  return;
}

Assistant:

void pnga_sprs_array_matvec_multiply(Integer s_a, Integer g_a, Integer g_v)
{
  Integer s_hdl = GA_OFFSET + s_a;
  int local_sync_begin,local_sync_end;
  Integer s_grp = SPA[s_hdl].grp;
  Integer me = pnga_pgroup_nodeid(s_grp);
  Integer nproc = pnga_pgroup_nnodes(s_grp);

  Integer ilo, ihi, jlo, jhi, klo, khi;
  void  *vsum, *vptr;
  int idx_size = SPA[s_hdl].idx_size;
  int64_t *ilptr = NULL, *jlptr = NULL;
  int *iptr = NULL, *jptr = NULL;
  Integer i, j, iproc, ncols;
  double one_r = 1.0;
  Integer one = 1;
  Integer adim, vdim, arank, vrank, dims[GA_MAX_DIM];
  Integer atype, vtype;
  Integer zflag;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(s_grp);
  /* Check that g_hdl and v_hdl are both vectors and that sizes
   * match */
  pnga_inquire(g_a, &atype, &arank, dims);
  adim = dims[0];
  pnga_inquire(g_v, &vtype, &vrank, dims);
  vdim = dims[0];
  if (arank != 1) pnga_error("rank of A must be 1 (vector)",arank);
  if (vrank != 1) pnga_error("rank of V must be 1 (vector)",vrank);
  if (adim != SPA[s_hdl].jdim) {
    pnga_error("length of A must equal second dimension of sparse matrix",adim);
  }
  if (vdim != SPA[s_hdl].jdim) {
    pnga_error("length of V must equal second dimension of sparse matrix",vdim);
  }
  if (atype != SPA[s_hdl].type || vtype != SPA[s_hdl].type) {
    pnga_error("Data type of sparse matrix and A and V vectors must match",
        SPA[s_hdl].type);
  }
  /* accumulate operation does not support type C_LONGLONG so fail if this
   * data type encountered */
  if (SPA[s_hdl].type == C_LONGLONG) {
    pnga_error("Data type of sparse matrix and A and V vectors"
        " cannot be of type long long",SPA[s_hdl].type);
  }


#define SPRS_REAL_MULTIPLY_M(_type,_iptr,_jptr)              \
  {                                                          \
    _type *_buf = (_type*)malloc((jhi-jlo+1)*sizeof(_type)); \
    _type *_sum = (_type*)vsum;                              \
    _type *_ptr = (_type*)vptr;                              \
    if (zflag) {                                             \
      for (i=ilo; i<=ihi; i++) {                             \
        _sum[i-ilo] = (_type)0;                              \
      }                                                      \
      zflag = 0;                                             \
    }                                                        \
    klo = jlo+1;                                             \
    khi = jhi+1;                                             \
    pnga_get(g_a,&klo,&khi,_buf,&one);                       \
    for (i=ilo; i<=ihi; i++) {                               \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                   \
      for (j=0; j<ncols; j++) {                              \
        _sum[i-ilo] += _ptr[_iptr[i-ilo]+j]                  \
                     * _buf[_jptr[_iptr[i-ilo]+j]-jlo];      \
      }                                                      \
    }                                                        \
    free(_buf);                                              \
  }
  
#define SPRS_COMPLEX_MULTIPLY_M(_type,_iptr,_jptr)             \
  {                                                            \
    _type *_buf = (_type*)malloc((jhi-jlo+1)*2*sizeof(_type)); \
    _type *_sum = (_type*)vsum;                                \
    _type *_ptr = (_type*)vptr;                                \
    _type rbuf,ibuf,rval,ival;                                 \
    if (zflag) {                                               \
      for (i=ilo; i<=ihi; i++) {                               \
        _sum[2*(i-ilo)] = 0.0;                                 \
        _sum[2*(i-ilo)+1] = 0.0;                               \
      }                                                        \
      zflag = 0;                                               \
    }                                                          \
    klo = jlo+1;                                               \
    khi = jhi+1;                                               \
    pnga_get(g_a,&klo,&khi,_buf,&one);                         \
    for (i=ilo; i<=ihi; i++) {                                 \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                     \
      for (j=0; j<ncols; j++) {                                \
            rbuf = _buf[2*(_jptr[_iptr[i-ilo]+j]-jlo)];        \
            ibuf = _buf[2*(_jptr[_iptr[i-ilo]+j]-jlo)+1];      \
            rval = _buf[2*(_iptr[i-ilo]+j)];                   \
            ival = _buf[2*(_iptr[i-ilo]+j)+1];                 \
            _sum[2*(i-ilo)] = rval*rbuf-ival*ibuf;             \
            _sum[2*(i-ilo)+1] = rval*ibuf+ival*rbuf;           \
      }                                                        \
    }                                                          \
    free(_buf);                                                \
  }
  
  /* Make sure product vector is zero */
  pnga_mask_sync(local_sync_begin,local_sync_end);
  pnga_zero(g_v);
  /* multiply sparse matrix by sparse vector */
  pnga_sprs_array_row_distribution(s_a,me,&ilo,&ihi);
  vsum = (void*)malloc((ihi-ilo+1)*SPA[s_hdl].size);
  zflag = 1;
  for (iproc=0; iproc<nproc; iproc++) {
    pnga_sprs_array_column_distribution(s_a,iproc,&jlo,&jhi);
    if (idx_size == 4) {
      pnga_sprs_array_access_col_block(s_a,iproc,&iptr,&jptr,&vptr);
      if (vptr != NULL) {
        if (SPA[s_hdl].type == C_INT) {
          SPRS_REAL_MULTIPLY_M(int,iptr,jptr);
        } else if (SPA[s_hdl].type == C_LONG) {
          SPRS_REAL_MULTIPLY_M(long,iptr,jptr);
        } else if (SPA[s_hdl].type == C_LONGLONG) {
          SPRS_REAL_MULTIPLY_M(long long,iptr,jptr);
        } else if (SPA[s_hdl].type == C_FLOAT) {
          SPRS_REAL_MULTIPLY_M(float,iptr,jptr);
        } else if (SPA[s_hdl].type == C_DBL) {
          SPRS_REAL_MULTIPLY_M(double,iptr,jptr);
        } else if (SPA[s_hdl].type == C_SCPL) {
          SPRS_COMPLEX_MULTIPLY_M(float,iptr,jptr);
        } else if (SPA[s_hdl].type == C_DCPL) {
          SPRS_COMPLEX_MULTIPLY_M(double,iptr,jptr);
        }
      }
    } else {
      pnga_sprs_array_access_col_block(s_a,iproc,&ilptr,&jlptr,&vptr);
      if (vptr != NULL) {
        if (SPA[s_hdl].type == C_INT) {
          SPRS_REAL_MULTIPLY_M(int,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_LONG) {
          SPRS_REAL_MULTIPLY_M(long,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_LONGLONG) {
          SPRS_REAL_MULTIPLY_M(long long,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_FLOAT) {
          SPRS_REAL_MULTIPLY_M(float,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_DBL) {
          SPRS_REAL_MULTIPLY_M(double,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_SCPL) {
          SPRS_COMPLEX_MULTIPLY_M(float,ilptr,jlptr);
        } else if (SPA[s_hdl].type == C_DCPL) {
          SPRS_COMPLEX_MULTIPLY_M(double,ilptr,jlptr);
        }
      }
    }
  }
#undef SPRS_REAL_MULTIPLY_M
#undef SPRS_COMPLEX_MULTIPLY_M

  if (ihi>=ilo) {
    klo = ilo + 1;
    khi = ihi + 1;
    pnga_acc(g_v,&klo,&khi,vsum,&one,&one_r);
  }
  if (local_sync_end)  pnga_pgroup_sync(s_grp);
  free(vsum);
}